

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

void Edg_ManCollectCritEdges(Gia_Man_t *p,Vec_Wec_t *vEdges,int DelayMax)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int Delay2;
  int Delay1;
  int iLut;
  int k;
  Vec_Int_t *vLevel;
  int DelayMax_local;
  Vec_Wec_t *vEdges_local;
  Gia_Man_t *p_local;
  
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    Vec_WecClear(vEdges);
    Vec_WecInit(vEdges,DelayMax + 1);
    Delay2 = 1;
    do {
      iVar1 = Gia_ManObjNum(p);
      if (iVar1 <= Delay2) {
        Delay1 = 1;
        while( true ) {
          iVar1 = Vec_WecSize(vEdges);
          if (iVar1 <= Delay1) {
            return;
          }
          p_00 = Vec_WecEntry(vEdges,Delay1);
          iVar1 = Vec_IntSize(p_00);
          if (iVar1 < 1) break;
          Delay1 = Delay1 + 1;
        }
        __assert_fail("Vec_IntSize(vLevel) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x302,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
      }
      iVar1 = Gia_ObjIsLut2(p,Delay2);
      if (iVar1 != 0) {
        iVar1 = Vec_IntEntry(p->vEdgeDelay,Delay2);
        iVar2 = Vec_IntEntry(p->vEdgeDelayR,Delay2);
        if (DelayMax < iVar1 + iVar2) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x2fb,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
        }
        if (iVar1 + iVar2 == DelayMax) {
          Vec_WecPush(vEdges,iVar1,Delay2);
        }
      }
      Delay2 = Delay2 + 1;
    } while( true );
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                ,0x2f4,"void Edg_ManCollectCritEdges(Gia_Man_t *, Vec_Wec_t *, int)");
}

Assistant:

void Edg_ManCollectCritEdges( Gia_Man_t * p, Vec_Wec_t * vEdges, int DelayMax )
{
    Vec_Int_t * vLevel;
    int k, iLut, Delay1, Delay2;
    assert( p->vEdge1 && p->vEdge2 );
    Vec_WecClear( vEdges );
    Vec_WecInit( vEdges, DelayMax + 1 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay1 = Vec_IntEntry( p->vEdgeDelay, iLut );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iLut );
        assert( Delay1 + Delay2 <= DelayMax );
        if ( Delay1 + Delay2 == DelayMax )
            Vec_WecPush( vEdges, Delay1, iLut );
    }
    // every level should have critical nodes, except the first one
    //Vec_WecPrint( vEdges, 0 );
    Vec_WecForEachLevelStart( vEdges, vLevel, k, 1 )
        assert( Vec_IntSize(vLevel) > 0 );
}